

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void al_restore_state(ALLEGRO_STATE *state)

{
  uint uVar1;
  thread_local_state *bitmap_00;
  ALLEGRO_BITMAP *pAVar2;
  int *in_RDI;
  ALLEGRO_BITMAP *bitmap_1;
  ALLEGRO_BITMAP *bitmap;
  int flags;
  INTERNAL_STATE *stored;
  thread_local_state *tls;
  ALLEGRO_DISPLAY *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  int *dest;
  
  bitmap_00 = tls_get();
  if (bitmap_00 != (thread_local_state *)0x0) {
    uVar1 = in_RDI[0xb4];
    if ((uVar1 & 1) != 0) {
      bitmap_00->new_display_flags = *in_RDI;
      bitmap_00->new_display_refresh_rate = in_RDI[1];
      bitmap_00->new_display_adapter = in_RDI[2];
      bitmap_00->new_window_x = in_RDI[3];
      bitmap_00->new_window_y = in_RDI[4];
      memcpy(&bitmap_00->new_display_settings,in_RDI + 8,0xb0);
      in_stack_ffffffffffffffc0 = bitmap_00->new_window_title;
      dest = in_RDI + 0x49;
      strlen(bitmap_00->new_window_title);
      _al_sane_strncpy((char *)dest,in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
    }
    if ((uVar1 & 2) != 0) {
      bitmap_00->new_bitmap_format = in_RDI[0x42];
      bitmap_00->new_bitmap_flags = in_RDI[0x43];
    }
    if (((uVar1 & 4) != 0) && (bitmap_00->current_display != *(ALLEGRO_DISPLAY **)(in_RDI + 0x34)))
    {
      _al_set_current_display_only(in_stack_ffffffffffffffb8);
    }
    if (((uVar1 & 8) != 0) && (bitmap_00->target_bitmap != *(ALLEGRO_BITMAP **)(in_RDI + 0x36))) {
      al_set_target_bitmap((ALLEGRO_BITMAP *)bitmap_00);
    }
    if ((uVar1 & 0x10) != 0) {
      memcpy(&bitmap_00->current_blender,in_RDI + 0x8a,0x28);
    }
    if ((uVar1 & 0x20) != 0) {
      bitmap_00->new_file_interface = *(ALLEGRO_FILE_INTERFACE **)(in_RDI + 0x44);
      bitmap_00->fs_interface = *(ALLEGRO_FS_INTERFACE **)(in_RDI + 0x46);
    }
    if (((uVar1 & 0x40) != 0) && (pAVar2 = al_get_target_bitmap(), pAVar2 != (ALLEGRO_BITMAP *)0x0))
    {
      al_use_transform((ALLEGRO_TRANSFORM *)in_stack_ffffffffffffffc0);
    }
    if (((uVar1 & 0x100) != 0) && (pAVar2 = al_get_target_bitmap(), pAVar2 != (ALLEGRO_BITMAP *)0x0)
       ) {
      al_use_projection_transform((ALLEGRO_TRANSFORM *)in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void al_restore_state(ALLEGRO_STATE const *state)
{
   thread_local_state *tls;
   INTERNAL_STATE *stored;
   int flags;

   if ((tls = tls_get()) == NULL)
      return;

   stored = (void *)state;
   flags = stored->flags;

#define _RESTORE(x) (tls->x = stored->tls.x)

   if (flags & ALLEGRO_STATE_NEW_DISPLAY_PARAMETERS) {
      _RESTORE(new_display_flags);
      _RESTORE(new_display_refresh_rate);
      _RESTORE(new_display_adapter);
      _RESTORE(new_window_x);
      _RESTORE(new_window_y);
      _RESTORE(new_display_settings);
      _al_sane_strncpy(tls->new_window_title, stored->tls.new_window_title,
                       strlen(tls->new_window_title));
   }

   if (flags & ALLEGRO_STATE_NEW_BITMAP_PARAMETERS) {
      _RESTORE(new_bitmap_format);
      _RESTORE(new_bitmap_flags);
   }

   if (flags & ALLEGRO_STATE_DISPLAY) {
      if (tls->current_display != stored->tls.current_display) {
         _al_set_current_display_only(stored->tls.current_display);
         ASSERT(tls->current_display == stored->tls.current_display);
      }
   }

   if (flags & ALLEGRO_STATE_TARGET_BITMAP) {
      if (tls->target_bitmap != stored->tls.target_bitmap) {
         al_set_target_bitmap(stored->tls.target_bitmap);
         ASSERT(tls->target_bitmap == stored->tls.target_bitmap);
      }
   }

   if (flags & ALLEGRO_STATE_BLENDER) {
      tls->current_blender = stored->stored_blender;
   }

   if (flags & ALLEGRO_STATE_NEW_FILE_INTERFACE) {
      _RESTORE(new_file_interface);
      _RESTORE(fs_interface);
   }

   if (flags & ALLEGRO_STATE_TRANSFORM) {
      ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();
      if (bitmap)
         al_use_transform(&stored->stored_transform);
   }

   if (flags & ALLEGRO_STATE_PROJECTION_TRANSFORM) {
      ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();
      if (bitmap)
         al_use_projection_transform(&stored->stored_projection_transform);
   }

#undef _RESTORE
}